

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O0

void __thiscall
spdlog::details::full_formatter::format(full_formatter *this,log_msg *msg,tm *tm_time)

{
  rep rVar1;
  BasicWriter<char> *pBVar2;
  size_t sVar3;
  char *pcVar4;
  BasicStringRef<char> local_f8;
  BasicStringRef<char> local_e8;
  BasicStringRef<char> local_d8;
  BasicStringRef<char> local_c8;
  BasicStringRef<char> local_b8;
  BasicStringRef<char> local_a8;
  IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> local_98;
  IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> local_88;
  IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> local_78;
  IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> local_68;
  IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> local_58;
  IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> local_48;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  long local_30;
  rep millis;
  duration duration;
  tm *tm_time_local;
  log_msg *msg_local;
  full_formatter *this_local;
  
  duration.__r = (rep)tm_time;
  millis = (rep)std::chrono::
                time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                ::time_since_epoch(&msg->time);
  local_38.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                ((duration<long,_std::ratio<1L,_1000000000L>_> *)&millis);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_38);
  local_30 = rVar1 % 1000;
  pBVar2 = fmt::BasicWriter<char>::operator<<(&(msg->formatted).super_BasicWriter<char>,'[');
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,*(int *)(duration.__r + 0x14) + 0x76c);
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,'-');
  local_48 = fmt::pad<char>(*(int *)(duration.__r + 0x10) + 1,2,'0');
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,local_48);
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,'-');
  local_58 = fmt::pad<char>(*(uint *)(duration.__r + 0xc),2,'0');
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,local_58);
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,' ');
  local_68 = fmt::pad<char>(*(uint *)(duration.__r + 8),2,'0');
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,local_68);
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,':');
  local_78 = fmt::pad<char>(*(uint *)(duration.__r + 4),2,'0');
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,local_78);
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,':');
  local_88 = fmt::pad<char>(*(uint *)duration.__r,2,'0');
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,local_88);
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,'.');
  local_98 = fmt::pad<char>((uint)local_30,3,'0');
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,local_98);
  fmt::BasicStringRef<char>::BasicStringRef(&local_a8,"] ");
  fmt::BasicWriter<char>::operator<<(pBVar2,local_a8);
  pBVar2 = fmt::BasicWriter<char>::operator<<(&(msg->formatted).super_BasicWriter<char>,'[');
  fmt::BasicStringRef<char>::BasicStringRef<std::allocator<char>>(&local_b8,msg->logger_name);
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,local_b8);
  fmt::BasicStringRef<char>::BasicStringRef(&local_c8,"] ");
  fmt::BasicWriter<char>::operator<<(pBVar2,local_c8);
  fmt::BasicWriter<char>::operator<<(&(msg->formatted).super_BasicWriter<char>,'[');
  sVar3 = fmt::BasicWriter<char>::size(&(msg->formatted).super_BasicWriter<char>);
  msg->color_range_start = sVar3;
  pcVar4 = level::to_str(msg->level);
  fmt::BasicStringRef<char>::BasicStringRef(&local_d8,pcVar4);
  fmt::BasicWriter<char>::operator<<(&(msg->formatted).super_BasicWriter<char>,local_d8);
  sVar3 = fmt::BasicWriter<char>::size(&(msg->formatted).super_BasicWriter<char>);
  msg->color_range_end = sVar3;
  fmt::BasicStringRef<char>::BasicStringRef(&local_e8,"] ");
  pBVar2 = fmt::BasicWriter<char>::operator<<(&(msg->formatted).super_BasicWriter<char>,local_e8);
  pcVar4 = fmt::BasicWriter<char>::data(&(msg->raw).super_BasicWriter<char>);
  sVar3 = fmt::BasicWriter<char>::size(&(msg->raw).super_BasicWriter<char>);
  fmt::BasicStringRef<char>::BasicStringRef(&local_f8,pcVar4,sVar3);
  fmt::BasicWriter<char>::operator<<(pBVar2,local_f8);
  return;
}

Assistant:

void format(details::log_msg &msg, const std::tm &tm_time) override
    {
#ifndef SPDLOG_NO_DATETIME
        auto duration = msg.time.time_since_epoch();
        auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(duration).count() % 1000;

        /* Slower version(while still very fast - about 3.2 million lines/sec under 10 threads),
        msg.formatted.write("[{:d}-{:02d}-{:02d} {:02d}:{:02d}:{:02d}.{:03d}] [{}] [{}] {} ",
        tm_time.tm_year + 1900,
        tm_time.tm_mon + 1,
        tm_time.tm_mday,
        tm_time.tm_hour,
        tm_time.tm_min,
        tm_time.tm_sec,
        static_cast<int>(millis),
        msg.logger_name,
        level::to_str(msg.level),
        msg.raw.str());*/

        // Faster (albeit uglier) way to format the line (5.6 million lines/sec under 10 threads)
        msg.formatted << '[' << static_cast<unsigned int>(tm_time.tm_year + 1900) << '-'
                      << fmt::pad(static_cast<unsigned int>(tm_time.tm_mon + 1), 2, '0') << '-'
                      << fmt::pad(static_cast<unsigned int>(tm_time.tm_mday), 2, '0') << ' '
                      << fmt::pad(static_cast<unsigned int>(tm_time.tm_hour), 2, '0') << ':'
                      << fmt::pad(static_cast<unsigned int>(tm_time.tm_min), 2, '0') << ':'
                      << fmt::pad(static_cast<unsigned int>(tm_time.tm_sec), 2, '0') << '.'
                      << fmt::pad(static_cast<unsigned int>(millis), 3, '0') << "] ";

        // no datetime needed
#else
        (void)tm_time;
#endif

#ifndef SPDLOG_NO_NAME
        msg.formatted << '[' << *msg.logger_name << "] ";
#endif

        msg.formatted << '[';
        // wrap the level name with color
        msg.color_range_start = msg.formatted.size();
        msg.formatted << level::to_str(msg.level);
        msg.color_range_end = msg.formatted.size();
        msg.formatted << "] " << fmt::StringRef(msg.raw.data(), msg.raw.size());
    }